

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O2

void get_interest_points(fasthessian *fh,
                        vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  long lVar1;
  response_layer *bottom;
  response_layer *middle;
  response_layer *top;
  bool bVar2;
  long lVar3;
  long lVar4;
  int c;
  int col;
  int r;
  int row;
  
  for (lVar4 = 0; lVar4 < fh->octaves; lVar4 = lVar4 + 1) {
    lVar3 = 0;
    while (lVar3 != 2) {
      lVar1 = lVar3 + 1;
      bottom = fh->response_map[(int)(&DAT_00110050)[lVar4 * 4 + lVar3]];
      middle = fh->response_map[(int)(&DAT_00110054)[lVar4 * 4 + lVar3]];
      top = fh->response_map[(int)(&DAT_00110058)[lVar4 * 4 + lVar3]];
      for (row = 0; lVar3 = lVar1, row < top->height; row = row + 1) {
        for (col = 0; col < top->width; col = col + 1) {
          bVar2 = is_extremum(row,col,top,middle,bottom,fh->thresh);
          if (bVar2) {
            interpolate_extremum(row,col,top,middle,bottom,interest_points);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void get_interest_points(struct fasthessian *fh, std::vector<struct interest_point> *interest_points) {

    assert(fh != NULL);
    assert(interest_points != NULL);

    // filter index map
    const int filter_map[NUM_OCTAVES][NUM_LAYERS] = {
        {0, 1, 2, 3},
        {1, 3, 4, 5},
        {3, 5, 6, 7},
        //{5, 7, 8, 9},
        //{7, 9, 10, 11}
    };

    // getting response layers
    struct response_layer *bottom;
    struct response_layer *middle;
    struct response_layer *top;

    // iterating through all octaves and each layer of octave in window of three (top, middle, bottom)
    for (int o = 0; o < fh->octaves; ++o) {

        // TODO: (Sebastian) allow for fh->layers != 4 as well (note that fh->layers>=3 has to hold)
        for (int i = 0; i <= 1; ++i) {

            // assigning respective bottom, middle and top response layer
            bottom = fh->response_map[filter_map[o][i]];
            middle = fh->response_map[filter_map[o][i+1]];
            top = fh->response_map[filter_map[o][i+2]];

            // iterating over middle response layer at density of the most sparse layer (always top),
            // to find maxima accreoss scale and space
            for (int r = 0; r < top->height; ++r) {
                for (int c = 0; c < top->width; ++c) {

                    // checking if current pixel position is local maximum in 3x3x3 maximum and above threshold
                    if (is_extremum(r, c, top, middle, bottom, fh->thresh)) {

                        // sub-pixel interpolating local maxium and adding to resulting interest point vector
                        interpolate_extremum(r, c, top, middle, bottom, interest_points);

                    }

                }
            }

        }
    }

}